

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::TreeEnsembleParameters::MergePartialFromCodedStream
          (TreeEnsembleParameters *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  int byte_limit;
  Type *this_00;
  pair<int,_int> pVar7;
  char cVar8;
  ulong uVar9;
  pair<unsigned_long,_bool> pVar10;
  
LAB_00145133:
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00145156;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00145156:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar9 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar5 | uVar9;
    }
    uVar5 = (uint32)uVar9;
    if ((uVar9 & 0x100000000) == 0) goto LAB_00145177;
    uVar6 = (uint)(uVar9 >> 3) & 0x1fffffff;
    cVar8 = (char)uVar9;
    if (uVar6 == 3) {
      if (cVar8 == '\x19') {
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (1,0x1a,input,&this->basepredictionvalue_);
      }
      else {
        if ((uVar5 & 0xff) != 0x1a) goto LAB_00145177;
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (input,&this->basepredictionvalue_);
      }
LAB_00145197:
      if (bVar4 == false) {
        return false;
      }
      goto LAB_00145133;
    }
    if (uVar6 != 2) {
      if ((uVar6 == 1) && (cVar8 == '\n')) {
        this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode>::TypeHandler>
                            (&(this->nodes_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (byte_limit = (int)(char)*puVar3, -1 < byte_limit)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (byte_limit < 0) {
            return false;
          }
        }
        pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,byte_limit);
        if ((long)pVar7 < 0) {
          return false;
        }
        bVar4 = TreeEnsembleParameters_TreeNode::MergePartialFromCodedStream(this_00,input);
        if (!bVar4) {
          return false;
        }
        bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                          (input,pVar7.first);
      }
      else {
LAB_00145177:
        if (uVar5 == 0) {
          return true;
        }
        if ((uVar5 & 7) == 4) {
          return true;
        }
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
      }
      goto LAB_00145197;
    }
    if (cVar8 != '\x10') goto LAB_00145177;
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) && (-1 < (long)(char)*puVar3)) {
      this->numpredictiondimensions_ = (long)(char)*puVar3;
      input->buffer_ = puVar3 + 1;
    }
    else {
      pVar10 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      this->numpredictiondimensions_ = pVar10.first;
      if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
  } while( true );
}

Assistant:

bool TreeEnsembleParameters::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.TreeEnsembleParameters)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode nodes = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_nodes()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 numPredictionDimensions = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &numpredictiondimensions_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated double basePredictionValue = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, this->mutable_basepredictionvalue())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(25u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 1, 26u, input, this->mutable_basepredictionvalue())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.TreeEnsembleParameters)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.TreeEnsembleParameters)
  return false;
#undef DO_
}